

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import-utils.h
# Opt level: O2

Index __thiscall wasm::ImportInfo::getNumImports(ImportInfo *this)

{
  return (int)((ulong)((long)(this->importedTables).
                             super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->importedTables).
                            super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3) +
         (int)((ulong)((long)(this->importedMemories).
                             super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->importedMemories).
                            super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3) +
         (int)((ulong)((long)(this->importedTags).
                             super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(this->importedTags).
                            super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 3) +
         (int)((ulong)((long)(this->importedFunctions).
                             super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->importedFunctions).
                            super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3) +
         (int)((ulong)((long)(this->importedGlobals).
                             super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->importedGlobals).
                            super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3);
}

Assistant:

Index getNumImports() {
    return getNumImportedGlobals() + getNumImportedFunctions() +
           getNumImportedTags() + getNumImportedMemories() +
           getNumImportedTables();
  }